

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall
leveldb::VersionEdit::SetCompactPointer(VersionEdit *this,int level,InternalKey *key)

{
  pair<int,_leveldb::InternalKey> local_48;
  InternalKey *local_20;
  InternalKey *key_local;
  VersionEdit *pVStack_10;
  int level_local;
  VersionEdit *this_local;
  
  local_20 = key;
  key_local._4_4_ = level;
  pVStack_10 = this;
  std::make_pair<int&,leveldb::InternalKey_const&>(&local_48,(int *)((long)&key_local + 4),key);
  std::
  vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ::push_back(&this->compact_pointers_,&local_48);
  std::pair<int,_leveldb::InternalKey>::~pair(&local_48);
  return;
}

Assistant:

void SetCompactPointer(int level, const InternalKey& key) {
    compact_pointers_.push_back(std::make_pair(level, key));
  }